

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_DCL(Context *ctx)

{
  RegisterType rtype;
  int regnum;
  int writemask;
  int flags;
  RegisterList *pRVar1;
  MOJOSHADER_samplerMap *pMVar2;
  ulong uVar3;
  MOJOSHADER_usage usage;
  MOJOSHADER_usage usage_00;
  
  rtype = (ctx->dest_arg).regtype;
  regnum = (ctx->dest_arg).regnum;
  if (ctx->instruction_count != 0) {
    failf(ctx,"%s","DCL token must come before any instructions");
    goto LAB_0011456b;
  }
  writemask = (ctx->dest_arg).writemask;
  flags = (ctx->dest_arg).result_mod;
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    usage_00 = ctx->dwords[0];
    if (rtype != REG_TYPE_SAMPLER) {
      add_attribute_register(ctx,rtype,regnum,usage_00,ctx->dwords[1],writemask,flags);
      goto LAB_0011456b;
    }
    pRVar1 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar2 = ctx->samplermap;
    if ((pMVar2 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar3 = 0;
      do {
        if (pMVar2[uVar3].index == regnum) goto LAB_001146ec;
        uVar3 = uVar3 + 1;
      } while (ctx->samplermap_count != uVar3);
    }
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      failf(ctx,"%s","unsupported shader type.");
      return;
    }
    usage_00 = ctx->dwords[0];
    if (rtype != REG_TYPE_SAMPLER) {
      if (MOJOSHADER_USAGE_SAMPLE < usage_00) {
        failf(ctx,"%s","unknown DCL usage");
        return;
      }
      add_attribute_register(ctx,rtype,regnum,usage_00,ctx->dwords[1],writemask,flags);
      goto LAB_0011456b;
    }
    pRVar1 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar2 = ctx->samplermap;
    if ((pMVar2 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar3 = 0;
      do {
        if (pMVar2[uVar3].index == regnum) goto LAB_001146ec;
        uVar3 = uVar3 + 1;
      } while (ctx->samplermap_count != uVar3);
    }
  }
  goto LAB_001146f5;
LAB_001146ec:
  usage_00 = pMVar2[uVar3].type + MOJOSHADER_SAMPLER_VOLUME;
LAB_001146f5:
  pRVar1->index = usage_00;
LAB_0011456b:
  reglist_insert(ctx,&ctx->defined_registers,rtype,regnum);
  return;
}

Assistant:

static void state_DCL(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;
    const RegisterType regtype = arg->regtype;
    const int regnum = arg->regnum;
    const int wmask = arg->writemask;
    const int mods = arg->result_mod;

    // parse_args_DCL() does a lot of state checking before we get here.

    // !!! FIXME: apparently vs_3_0 can use sampler registers now.
    // !!! FIXME:  (but only s0 through s3, not all 16 of them.)

    if (ctx->instruction_count != 0)
        fail(ctx, "DCL token must come before any instructions");

    else if (shader_is_vertex(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (const MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            if (usage >= MOJOSHADER_USAGE_TOTAL)
            {
                fail(ctx, "unknown DCL usage");
                return;
            } // if
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // else if

    else
    {
        fail(ctx, "unsupported shader type."); // should be caught elsewhere.
        return;
    } // else

    set_defined_register(ctx, regtype, regnum);
}